

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateGetRootAsAccessors
          (KotlinGenerator *this,string *struct_name,CodeWriter *writer,IDLOptions *options)

{
  IDLOptions *this_00;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  IDLOptions *local_28;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  string *struct_name_local;
  KotlinGenerator *this_local;
  
  local_28 = options;
  options_local = (IDLOptions *)writer;
  writer_local = (CodeWriter *)struct_name;
  struct_name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"gr_name",&local_49);
  CodeWriter::SetValue(writer,&local_48,(string *)writer_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"gr_method",&local_81);
  std::operator+(&local_a8,"getRootAs",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)writer_local);
  CodeWriter::SetValue((CodeWriter *)this_00,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  GenerateJvmStaticAnnotation((CodeWriter *)options_local,(bool)(options->gen_jvmstatic & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"fun {{gr_method}}(_bb: ByteBuffer): {{gr_name}} = \\",&local_c9);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"{{gr_method}}(_bb, {{gr_name}}())",&local_f1);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  GenerateJvmStaticAnnotation((CodeWriter *)options_local,(bool)(options->gen_jvmstatic & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "fun {{gr_method}}(_bb: ByteBuffer, obj: {{gr_name}}): {{gr_name}} {",&local_119);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  CodeWriter::IncrementIdentLevel((CodeWriter *)options_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"_bb.order(ByteOrder.LITTLE_ENDIAN)",&local_141);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,
             "return (obj.__assign(_bb.getInt(_bb.position()) + _bb.position(), _bb))",&local_169);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  CodeWriter::DecrementIdentLevel((CodeWriter *)options_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"}",&local_191);
  CodeWriter::operator+=((CodeWriter *)options_local,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  return;
}

Assistant:

void GenerateGetRootAsAccessors(const std::string &struct_name,
                                  CodeWriter &writer,
                                  IDLOptions options) const {
    // Generate a special accessor for the table that when used as the root
    // ex: fun getRootAsMonster(_bb: ByteBuffer): Monster {...}
    writer.SetValue("gr_name", struct_name);
    writer.SetValue("gr_method", "getRootAs" + struct_name);

    // create convenience method that doesn't require an existing object
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    writer += "fun {{gr_method}}(_bb: ByteBuffer): {{gr_name}} = \\";
    writer += "{{gr_method}}(_bb, {{gr_name}}())";

    // create method that allows object reuse
    // ex: fun Monster getRootAsMonster(_bb: ByteBuffer, obj: Monster) {...}
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    writer +=
        "fun {{gr_method}}"
        "(_bb: ByteBuffer, obj: {{gr_name}}): {{gr_name}} {";
    writer.IncrementIdentLevel();
    writer += "_bb.order(ByteOrder.LITTLE_ENDIAN)";
    writer +=
        "return (obj.__assign(_bb.getInt(_bb.position())"
        " + _bb.position(), _bb))";
    writer.DecrementIdentLevel();
    writer += "}";
  }